

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O0

void canvas_resortinlets(_glist *x)

{
  int iVar1;
  bool bVar2;
  t_gobj *g;
  int y2;
  int x2;
  int y1;
  int x1;
  _inlet *ip;
  t_gobj **maxp;
  t_gobj **vp;
  t_gobj **vec;
  t_gobj *y;
  int xmax;
  int j;
  int i;
  int ninlets;
  _glist *x_local;
  
  j = 0;
  for (vec = (t_gobj **)x->gl_list; vec != (t_gobj **)0x0; vec = (t_gobj **)vec[1]) {
    if ((_class *)*vec == vinlet_class) {
      j = j + 1;
    }
  }
  if (1 < j) {
    _i = x;
    vp = (t_gobj **)getbytes((long)j << 3);
    maxp = vp;
    for (vec = (t_gobj **)_i->gl_list; vec != (t_gobj **)0x0; vec = (t_gobj **)vec[1]) {
      if ((_class *)*vec == vinlet_class) {
        *maxp = (t_gobj *)vec;
        maxp = maxp + 1;
      }
    }
    xmax = j;
    while (iVar1 = xmax + -1, bVar2 = xmax != 0, xmax = iVar1, bVar2) {
      maxp = vp;
      y._0_4_ = -0x7fffffff;
      ip = (_inlet *)0x0;
      y._4_4_ = j;
      while (iVar1 = y._4_4_ + -1, y._4_4_ != 0) {
        y._4_4_ = iVar1;
        if ((*maxp != (t_gobj *)0x0) &&
           (gobj_getrect(*maxp,_i,&x2,&y2,(int *)((long)&g + 4),(int *)&g), (int)y < x2)) {
          y._0_4_ = x2;
          ip = (_inlet *)maxp;
        }
        maxp = maxp + 1;
      }
      y._4_4_ = iVar1;
      if (ip == (_inlet *)0x0) break;
      vec = (t_gobj **)ip->i_pd;
      ip->i_pd = (t_pd)0x0;
      _y1 = vinlet_getit((t_pd *)vec);
      obj_moveinletfirst(&_i->gl_obj,_y1);
    }
    freebytes(vp,(long)j << 3);
    if (((_i->gl_owner != (_glist *)0x0) && ((*(ushort *)&_i->field_0xe8 >> 0xb & 1) == 0)) &&
       (iVar1 = glist_isvisible(_i->gl_owner), iVar1 != 0)) {
      canvas_fixlinesfor(_i->gl_owner,&_i->gl_obj);
    }
  }
  return;
}

Assistant:

void canvas_resortinlets(t_canvas *x)
{
    int ninlets = 0, i, j, xmax;
    t_gobj *y, **vec, **vp, **maxp;

    for (ninlets = 0, y = x->gl_list; y; y = y->g_next)
        if (pd_class(&y->g_pd) == vinlet_class) ninlets++;

    if (ninlets < 2) return;

    vec = (t_gobj **)getbytes(ninlets * sizeof(*vec));

    for (y = x->gl_list, vp = vec; y; y = y->g_next)
        if (pd_class(&y->g_pd) == vinlet_class) *vp++ = y;

    for (i = ninlets; i--;)
    {
        t_inlet *ip;
        for (vp = vec, xmax = -0x7fffffff, maxp = 0, j = ninlets;
            j--; vp++)
        {
            int x1, y1, x2, y2;
            t_gobj *g = *vp;
            if (!g) continue;
            gobj_getrect(g, x, &x1, &y1, &x2, &y2);
            if (x1 > xmax) xmax = x1, maxp = vp;
        }
        if (!maxp) break;
        y = *maxp;
        *maxp = 0;
        ip = vinlet_getit(&y->g_pd);

        obj_moveinletfirst(&x->gl_obj, ip);
    }
    freebytes(vec, ninlets * sizeof(*vec));
    if (x->gl_owner && !x->gl_isclone && glist_isvisible(x->gl_owner))
        canvas_fixlinesfor(x->gl_owner, &x->gl_obj);
}